

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O1

uint __thiscall pktalloc::Allocator::GetMemoryUsedBytes(Allocator *this)

{
  uint uVar1;
  WindowHeader *pWVar2;
  int iVar3;
  uint uVar4;
  
  uVar1 = (this->PreferredWindows).Size;
  if (uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    uVar4 = 0;
    do {
      pWVar2 = (this->PreferredWindows).DataPtr[(int)uVar4];
      if (pWVar2 != (WindowHeader *)0x0) {
        iVar3 = (iVar3 - pWVar2->FreeUnitCount) + 0x800;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  uVar1 = (this->FullWindows).Size;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      pWVar2 = (this->FullWindows).DataPtr[(int)uVar4];
      if (pWVar2 != (WindowHeader *)0x0) {
        iVar3 = (iVar3 - pWVar2->FreeUnitCount) + 0x800;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return iVar3 << 5;
}

Assistant:

PKTALLOC_FORCE_INLINE unsigned GetSize() const
    {
        return Size;
    }